

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O3

int __thiscall ncnn::LSTM::load_model(LSTM *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  void *local_70;
  int *local_68;
  size_t local_60;
  int local_58;
  Allocator *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  size_t local_38;
  
  uVar6 = (this->direction == 2) + 1;
  uVar4 = (long)this->weight_data_size / (long)(int)uVar6;
  iVar7 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
               (long)this->num_output);
  iVar5 = iVar7 + 3;
  if (-1 < iVar7) {
    iVar5 = iVar7;
  }
  (*mb->_vptr_ModelBin[4])
            (&local_70,mb,(ulong)(uint)(iVar5 >> 2),(ulong)(uint)(this->num_output << 2),
             (ulong)uVar6,0);
  if (&this->weight_xc_data != (Mat *)&local_70) {
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + 1;
      UNLOCK();
    }
    piVar1 = (this->weight_xc_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->weight_xc_data).data;
        pAVar3 = (this->weight_xc_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 0x18))();
        }
      }
    }
    (this->weight_xc_data).data = local_70;
    (this->weight_xc_data).refcount = local_68;
    (this->weight_xc_data).elemsize = local_60;
    (this->weight_xc_data).elempack = local_58;
    (this->weight_xc_data).allocator = local_50;
    (this->weight_xc_data).dims = local_48;
    (this->weight_xc_data).w = iStack_44;
    (this->weight_xc_data).h = iStack_40;
    (this->weight_xc_data).c = iStack_3c;
    (this->weight_xc_data).cstep = local_38;
  }
  if (local_68 != (int *)0x0) {
    LOCK();
    *local_68 = *local_68 + -1;
    UNLOCK();
    if (*local_68 == 0) {
      if (local_50 == (Allocator *)0x0) {
        if (local_70 != (void *)0x0) {
          free(local_70);
        }
      }
      else {
        (**(code **)(*(long *)local_50 + 0x18))();
      }
    }
  }
  iVar7 = -100;
  if (((this->weight_xc_data).data != (void *)0x0) &&
     ((long)(this->weight_xc_data).c * (this->weight_xc_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[4])(&local_70,mb,(ulong)(uint)this->num_output,4,(ulong)uVar6,0);
    if (&this->bias_c_data != (Mat *)&local_70) {
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + 1;
        UNLOCK();
      }
      piVar1 = (this->bias_c_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->bias_c_data).data;
          pAVar3 = (this->bias_c_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (**(code **)(*(long *)pAVar3 + 0x18))();
          }
        }
      }
      (this->bias_c_data).data = local_70;
      (this->bias_c_data).refcount = local_68;
      (this->bias_c_data).elemsize = local_60;
      (this->bias_c_data).elempack = local_58;
      (this->bias_c_data).allocator = local_50;
      (this->bias_c_data).dims = local_48;
      (this->bias_c_data).w = iStack_44;
      (this->bias_c_data).h = iStack_40;
      (this->bias_c_data).c = iStack_3c;
      (this->bias_c_data).cstep = local_38;
    }
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + -1;
      UNLOCK();
      if (*local_68 == 0) {
        if (local_50 == (Allocator *)0x0) {
          if (local_70 != (void *)0x0) {
            free(local_70);
          }
        }
        else {
          (**(code **)(*(long *)local_50 + 0x18))();
        }
      }
    }
    if (((this->bias_c_data).data != (void *)0x0) &&
       ((long)(this->bias_c_data).c * (this->bias_c_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[4])
                (&local_70,mb,(ulong)(uint)this->num_output,(ulong)(uint)(this->num_output * 4),
                 (ulong)uVar6,0);
      if (&this->weight_hc_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->weight_hc_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->weight_hc_data).data;
            pAVar3 = (this->weight_hc_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (**(code **)(*(long *)pAVar3 + 0x18))();
            }
          }
        }
        (this->weight_hc_data).data = local_70;
        (this->weight_hc_data).refcount = local_68;
        (this->weight_hc_data).elemsize = local_60;
        (this->weight_hc_data).elempack = local_58;
        (this->weight_hc_data).allocator = local_50;
        (this->weight_hc_data).dims = local_48;
        (this->weight_hc_data).w = iStack_44;
        (this->weight_hc_data).h = iStack_40;
        (this->weight_hc_data).c = iStack_3c;
        (this->weight_hc_data).cstep = local_38;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            if (local_70 != (void *)0x0) {
              free(local_70);
            }
          }
          else {
            (**(code **)(*(long *)local_50 + 0x18))();
          }
        }
      }
      if (((this->weight_hc_data).data == (void *)0x0) ||
         (iVar7 = 0, (long)(this->weight_hc_data).c * (this->weight_hc_data).cstep == 0)) {
        iVar7 = -100;
      }
    }
  }
  return iVar7;
}

Assistant:

int LSTM::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / num_output / 4;

    // raw weight data
    weight_xc_data = mb.load(size, num_output * 4, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(num_output, 4, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, num_output * 4, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

    return 0;
}